

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_factory.hpp
# Opt level: O3

uint __thiscall
boost::runtime::value_interpreter<unsigned_int,_false>::interpret
          (value_interpreter<unsigned_int,_false> *this,cstring *param_name,cstring *source)

{
  bool bVar1;
  uint res;
  uint local_13c;
  const_string local_138;
  undefined **local_128;
  iterator local_120;
  iterator pvStack_118;
  undefined1 *local_110;
  undefined8 local_108;
  undefined1 local_100 [16];
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> local_f0;
  format_error local_b8;
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> local_80;
  format_error local_48;
  
  local_138.m_begin = source->m_begin;
  local_138.m_end = source->m_end;
  bVar1 = unit_test::utils::string_as<unsigned_int>(&local_138,&local_13c);
  if (bVar1) {
    return local_13c;
  }
  local_120 = param_name->m_begin;
  pvStack_118 = param_name->m_end;
  local_110 = local_100;
  local_108 = 0;
  local_100[0] = 0;
  local_128 = &PTR__param_error_001ca150;
  specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::operator<<
            ((format_error *)&local_f0,
             (specific_param_error<boost::runtime::format_error,boost::runtime::input_error> *)
             &local_128,source);
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::operator<<
            (&local_b8,&local_f0," can\'t be interpreted as value of parameter ");
  specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::operator<<
            ((format_error *)&local_80,
             (specific_param_error<boost::runtime::format_error,boost::runtime::input_error> *)
             &local_b8,param_name);
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::operator<<
            (&local_48,&local_80,".");
  unit_test::ut_detail::throw_exception<boost::runtime::format_error>(&local_48);
}

Assistant:

ValueType interpret( cstring param_name, cstring source ) const
    {
        ValueType res;
        if( !unit_test::utils::string_as<ValueType>( source, res ) )
            BOOST_TEST_I_THROW( format_error( param_name ) << source <<
                                " can't be interpreted as value of parameter " << param_name << "." );
        return res;
    }